

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O1

void __thiscall
RandomForest::Node<float>::GetSampleList
          (Node<float> *this,shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_posSampleList,
          shared_ptr<std::vector<int,_std::allocator<int>_>_> *o_negSampleList)

{
  Node<float> *pNVar1;
  element_type *peVar2;
  iterator __position;
  pointer piVar3;
  ulong uVar4;
  vector<int,std::allocator<int>> *this_00;
  float fVar5;
  int tempIndex;
  int local_88;
  float local_84;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_80;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_70;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_60;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> local_50;
  long *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (this->featureIndex == -1) {
    peVar2 = (this->sampleIndexList).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    piVar3 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    if ((peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar3) {
      uVar4 = 0;
      do {
        local_88 = piVar3[uVar4];
        ODTree<float>::GetTrainData(this->tree);
        if ((ulong)(local_40[1] - *local_40 >> 4) <= (ulong)(long)local_88) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        fVar5 = *(float *)(*(long *)(*(long *)(*local_40 + (long)local_88 * 0x10) + 8) + -4);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_84 = fVar5;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          fVar5 = local_84;
        }
        if (fVar5 <= 0.0) {
          this_00 = (vector<int,std::allocator<int>> *)
                    (o_negSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        else {
          this_00 = (vector<int,std::allocator<int>> *)
                    (o_posSampleList->
                    super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        __position._M_current = *(int **)(this_00 + 8);
        if (__position._M_current == *(int **)(this_00 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this_00,__position,&local_88);
        }
        else {
          *__position._M_current = local_88;
          *(int **)(this_00 + 8) = __position._M_current + 1;
        }
        uVar4 = uVar4 + 1;
        peVar2 = (this->sampleIndexList).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        piVar3 = (peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar4 < (ulong)((long)(peVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
    }
  }
  else {
    pNVar1 = (this->left).super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (pNVar1 != (Node<float> *)0x0) {
      local_50.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (o_posSampleList->
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
      local_50.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (o_posSampleList->
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_50.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_50.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_50.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_50.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_60.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (o_negSampleList->
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
      local_60.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (o_negSampleList->
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_60.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_60.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_60.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_60.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      GetSampleList(pNVar1,&local_50,&local_60);
      if (local_60.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_50.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
    pNVar1 = (this->right).super___shared_ptr<RandomForest::Node<float>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (pNVar1 != (Node<float> *)0x0) {
      local_70.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (o_posSampleList->
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
      local_70.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (o_posSampleList->
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_70.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_70.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_80.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (o_negSampleList->
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr;
      local_80.
      super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (o_negSampleList->
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_80.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_80.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_80.
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_80.
                super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      GetSampleList(pNVar1,&local_70,&local_80);
      if (local_80.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_70.
          super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.
                   super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
    }
  }
  return;
}

Assistant:

void RandomForest::Node<T>::GetSampleList(std::shared_ptr<std::vector<int> > o_posSampleList, std::shared_ptr<std::vector<int> > o_negSampleList) const
{
    if (featureIndex==-1)
    {
        for(int i=0; i<sampleIndexList->size(); i++)
        {
            int tempIndex=sampleIndexList->at(i);
            T label=tree->GetTrainData()->at(tempIndex)->back();
            if (label > 0)
            {
                o_posSampleList->push_back(tempIndex);
            }
            else{
                o_negSampleList->push_back(tempIndex);
            }
        }
        return;
    }
    if (left)
    {
        left->GetSampleList(o_posSampleList,o_negSampleList);
    }

    if (right)
    {
        right->GetSampleList(o_posSampleList,o_negSampleList);
    }
}